

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O3

bool __thiscall
tcu::isLinearSampleResultValid
          (tcu *this,ConstPixelBufferAccess *level,Sampler *sampler,LookupPrecision *prec,
          float coordX,int coordY,Vec4 *result)

{
  int size;
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  int y;
  int z;
  int c;
  undefined4 in_register_00000084;
  Vec2 *fBounds;
  int iVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  Vec4 colorB;
  Vec4 colorA;
  Vec2 uBounds;
  Vec4 local_78;
  undefined1 local_68 [24];
  Vec4 *local_50;
  float local_48;
  float fStack_44;
  
  local_50 = (Vec4 *)CONCAT44(in_register_00000084,coordY);
  z = (int)prec;
  fBounds = (Vec2 *)(ulong)sampler->minFilter;
  local_68._16_8_ = sampler;
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_48,SUB41((level->m_pitch).m_data[1],0),*(int *)(this + 8),
             coordX,sampler->wrapS,sampler->minFilter);
  fVar6 = floorf(local_48 + -0.5);
  fVar7 = floorf(fStack_44 + -0.5);
  size = *(int *)(this + 8);
  getTextureChannelClass(*(ChannelType *)(this + 4));
  iVar3 = (int)fVar6;
  do {
    c = iVar3;
    if ((int)fVar7 < c) break;
    iVar3 = TexVerifierUtil::wrap((level->m_format).order,c,size);
    y = TexVerifierUtil::wrap((level->m_format).order,c + 1,size);
    iVar4 = -(uint)((local_48 + -0.5) - (float)c < 0.0);
    iVar5 = -(uint)((fStack_44 + -0.5) - (float)c < 0.0);
    auVar1._4_4_ = iVar4;
    auVar1._0_4_ = iVar4;
    auVar1._8_4_ = iVar5;
    auVar1._12_4_ = iVar5;
    movmskpd(y,auVar1);
    if ((((iVar3 < 0) || (*(int *)(this + 8) <= iVar3)) || (z < 0)) ||
       ((*(int *)(this + 0xc) <= z || (*(int *)(this + 0x10) < 1)))) {
      sampleTextureBorder<float>((TextureFormat *)local_68,(Sampler *)this);
    }
    else {
      fBounds = (Vec2 *)0x0;
      ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)&stack0xffffffffffffffc0,(int)this,iVar3,z);
      bVar2 = isSRGB(*(TextureFormat *)this);
      if (bVar2) {
        sRGBToLinear((tcu *)local_68,(Vec4 *)&stack0xffffffffffffffc0);
      }
    }
    if (((y < 0) || (*(int *)(this + 8) <= y)) ||
       ((z < 0 || ((*(int *)(this + 0xc) <= z || (*(int *)(this + 0x10) < 1)))))) {
      sampleTextureBorder<float>((TextureFormat *)&local_78,(Sampler *)this);
    }
    else {
      fBounds = (Vec2 *)0x0;
      ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)&stack0xffffffffffffffc0,(int)this,y,z);
      bVar2 = isSRGB(*(TextureFormat *)this);
      if (bVar2) {
        sRGBToLinear((tcu *)&local_78,(Vec4 *)&stack0xffffffffffffffc0);
      }
    }
    bVar2 = isLinearRangeValid((tcu *)local_68._16_8_,(LookupPrecision *)local_68,&local_78,local_50
                               ,fBounds,result);
    iVar3 = c + 1;
  } while (!bVar2);
  return c <= (int)fVar7;
}

Assistant:

bool isLinearSampleResultValid (const ConstPixelBufferAccess&		level,
								const Sampler&						sampler,
								const LookupPrecision&				prec,
								const float							coordX,
								const int							coordY,
								const Vec4&							result)
{
	const Vec2					uBounds			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getWidth(), coordX, prec.coordBits.x(), prec.uvwBits.x());

	const int					minI			= deFloorFloatToInt32(uBounds.x()-0.5f);
	const int					maxI			= deFloorFloatToInt32(uBounds.y()-0.5f);

	const int					w				= level.getWidth();

	const TextureFormat			format			= level.getFormat();
	const TextureChannelClass	texClass		= getTextureChannelClass(format.type);

	DE_ASSERT(texClass == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT	||
			  texClass == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT	||
			  texClass == TEXTURECHANNELCLASS_FLOATING_POINT);
	DE_UNREF(texClass);
	DE_UNREF(format);

	for (int i = minI; i <= maxI; i++)
	{
		// Wrapped coordinates
		const int	x0		= wrap(sampler.wrapS, i  , w);
		const int	x1		= wrap(sampler.wrapS, i+1, w);

		// Bounds for filtering factors
		const float	minA	= de::clamp((uBounds.x()-0.5f)-float(i), 0.0f, 1.0f);
		const float	maxA	= de::clamp((uBounds.y()-0.5f)-float(i), 0.0f, 1.0f);

		const Vec4	colorA	= lookup<float>(level, sampler, x0, coordY, 0);
		const Vec4	colorB	= lookup<float>(level, sampler, x1, coordY, 0);

		if (isLinearRangeValid(prec, colorA, colorB, Vec2(minA, maxA), result))
			return true;
	}

	return false;
}